

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O0

UnicodeSet * __thiscall
icu_63::Transliterator::getSourceSet(Transliterator *this,UnicodeSet *result)

{
  bool bVar1;
  UnicodeSet *pUVar2;
  pointer_____offset_0x10___ *size;
  UnicodeSet *local_70;
  UnicodeSet *local_68;
  UnicodeSet *pUStack_28;
  UBool deleteFilterSet;
  UnicodeSet *filterSet;
  UnicodeSet *result_local;
  Transliterator *this_local;
  
  size = (pointer_____offset_0x10___ *)result;
  (*(this->super_UObject)._vptr_UObject[0xf])();
  if (this->filter != (UnicodeFilter *)0x0) {
    if (this->filter == (UnicodeFilter *)0x0) {
      local_68 = (UnicodeSet *)0x0;
    }
    else {
      size = &UnicodeFilter::typeinfo;
      local_68 = (UnicodeSet *)
                 __dynamic_cast(this->filter,&UnicodeFilter::typeinfo,&UnicodeSet::typeinfo,0);
    }
    pUStack_28 = local_68;
    bVar1 = false;
    if (local_68 == (UnicodeSet *)0x0) {
      pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)size);
      local_70 = (UnicodeSet *)0x0;
      if (pUVar2 != (UnicodeSet *)0x0) {
        UnicodeSet::UnicodeSet(pUVar2);
        local_70 = pUVar2;
      }
      pUStack_28 = local_70;
      if (local_70 == (UnicodeSet *)0x0) {
        return result;
      }
      bVar1 = true;
      (*(this->filter->super_UnicodeMatcher)._vptr_UnicodeMatcher[5])
                (&this->filter->super_UnicodeMatcher,local_70);
    }
    pUVar2 = pUStack_28;
    UnicodeSet::retainAll(result,pUStack_28);
    if ((bVar1) && (pUStack_28 != (UnicodeSet *)0x0)) {
      UnicodeSet::~UnicodeSet(pUStack_28);
      UMemory::operator_delete((UMemory *)pUStack_28,pUVar2);
    }
  }
  return result;
}

Assistant:

UnicodeSet& Transliterator::getSourceSet(UnicodeSet& result) const {
    handleGetSourceSet(result);
    if (filter != NULL) {
        UnicodeSet* filterSet = dynamic_cast<UnicodeSet*>(filter);
        UBool deleteFilterSet = FALSE;
        // Most, but not all filters will be UnicodeSets.  Optimize for
        // the high-runner case.
        if (filterSet == NULL) {
            filterSet = new UnicodeSet();
            // Check null pointer
            if (filterSet == NULL) {
                return result;
            }
            deleteFilterSet = TRUE;
            filter->addMatchSetTo(*filterSet);
        }
        result.retainAll(*filterSet);
        if (deleteFilterSet) {
            delete filterSet;
        }
    }
    return result;
}